

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O0

int check_rsi(test_state *state)

{
  long in_RDI;
  uchar *tmp;
  int size;
  int status;
  test_state *in_stack_ffffffffffffffd8;
  ulong local_20;
  int iVar1;
  int local_4;
  
  iVar1 = *(int *)(in_RDI + 0xc);
  for (local_20 = *(ulong *)(in_RDI + 0x10);
      local_20 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
      local_20 = local_20 + (long)(*(int *)(in_RDI + 0xc) << 1)) {
    (**(code **)(in_RDI + 0x50))(local_20,*(undefined8 *)(in_RDI + 0x40),iVar1);
    (**(code **)(in_RDI + 0x50))(local_20 + (long)iVar1,*(undefined8 *)(in_RDI + 0x48),iVar1);
  }
  printf("Checking full rsi ... ");
  local_4 = check_block_sizes(in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    printf("Checking short rsi ... ");
    local_4 = check_block_sizes_short((test_state *)CONCAT44(local_4,iVar1));
    if (local_4 == 0) {
      printf("%s\n","\x1b[0;32mPASS\x1b[0m");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int check_rsi(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    for (tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * state->bytes_per_sample) {
        state->out(tmp, state->xmax, size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking full rsi ... ");
    status = check_block_sizes(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);

    printf("Checking short rsi ... ");
    status = check_block_sizes_short(state);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}